

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkDfsReverseNodesContained(Abc_Ntk_t *pNtk,Abc_Obj_t **ppNodes,int nNodes)

{
  undefined4 uVar1;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int *piVar9;
  Vec_Ptr_t *pVVar10;
  void **__s;
  void **ppvVar11;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  undefined8 extraout_RDX_00;
  void **ppvVar13;
  void **ppvVar14;
  void **extraout_RDX_01;
  void **extraout_RDX_02;
  int iVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  long *plVar21;
  
  iVar7 = Abc_NtkLevel(pNtk);
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar16 = pNtk->vObjs->nSize;
    uVar18 = (long)iVar16 + 500;
    iVar15 = (int)uVar18;
    if ((pNtk->vTravIds).nCap < iVar15) {
      piVar9 = (int *)malloc(uVar18 * 4);
      (pNtk->vTravIds).pArray = piVar9;
      if (piVar9 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar15;
    }
    if (-500 < iVar16) {
      memset((pNtk->vTravIds).pArray,0,(uVar18 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar15;
  }
  iVar16 = pNtk->nTravIds;
  pNtk->nTravIds = iVar16 + 1;
  if (0x3ffffffe < iVar16) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  uVar20 = iVar7 + 2;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  uVar8 = 8;
  if (6 < iVar7 + 1U) {
    uVar8 = uVar20;
  }
  pVVar10->nSize = 0;
  pVVar10->nCap = uVar8;
  if (uVar8 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar8 << 3);
  }
  pVVar10->pArray = __s;
  pVVar10->nSize = uVar20;
  memset(__s,0,(long)(int)uVar20 << 3);
  if (0 < nNodes) {
    uVar18 = 0;
    uVar12 = extraout_RDX;
    do {
      pAVar2 = ppNodes[uVar18];
      uVar8 = *(uint *)&pAVar2->field_0x14 & 0xf;
      if ((uVar8 != 2) && (uVar8 != 5)) {
        __assert_fail("Abc_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                      ,0x157,
                      "Vec_Ptr_t *Abc_NtkDfsReverseNodesContained(Abc_Ntk_t *, Abc_Obj_t **, int)");
      }
      pAVar3 = pAVar2->pNtk;
      iVar16 = pAVar3->nTravIds;
      iVar15 = pAVar2->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar15 + 1,(int)uVar12);
      if (((long)iVar15 < 0) || ((pAVar3->vTravIds).nSize <= iVar15)) {
LAB_00839c50:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar3->vTravIds).pArray[iVar15] = iVar16;
      if (0xfff < *(uint *)&pAVar2->field_0x14) {
        __assert_fail("pObj->Level == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                      ,0x15a,
                      "Vec_Ptr_t *Abc_NtkDfsReverseNodesContained(Abc_Ntk_t *, Abc_Obj_t **, int)");
      }
      if (iVar7 < -1) goto LAB_00839c6f;
      (pAVar2->field_6).pCopy = (Abc_Obj_t *)*__s;
      *__s = pAVar2;
      uVar18 = uVar18 + 1;
      uVar12 = extraout_RDX_00;
    } while ((uint)nNodes != uVar18);
  }
  if (-1 < iVar7) {
    ppvVar11 = (void **)0x0;
    ppvVar13 = (void **)0x0;
    ppvVar14 = ppvVar13;
    if (0 < (int)uVar20) {
      ppvVar13 = (void **)(ulong)uVar20;
      ppvVar14 = ppvVar13;
    }
    do {
      if (ppvVar11 == ppvVar14) {
LAB_00839c6f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      for (plVar21 = (long *)__s[(long)ppvVar11]; plVar21 != (long *)0x0;
          plVar21 = (long *)plVar21[8]) {
        if (0 < *(int *)((long)plVar21 + 0x2c)) {
          lVar19 = 0;
          do {
            plVar4 = *(long **)(*(long *)(*(long *)(*plVar21 + 0x20) + 8) +
                               (long)*(int *)(plVar21[6] + lVar19 * 4) * 8);
            lVar17 = *plVar4;
            iVar16 = (int)plVar4[2];
            Vec_IntFillExtra((Vec_Int_t *)(lVar17 + 0xe0),iVar16 + 1,(int)ppvVar13);
            if (((long)iVar16 < 0) || (*(int *)(lVar17 + 0xe4) <= iVar16)) {
LAB_00839c31:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            ppvVar13 = extraout_RDX_01;
            if (*(int *)(*(long *)(lVar17 + 0xe8) + (long)iVar16 * 4) != *(int *)(*plVar4 + 0xd8)) {
              if (*(int *)((long)plVar4 + 0x1c) < 1) {
                iVar16 = 0;
                ppvVar13 = extraout_RDX_01;
              }
              else {
                lVar17 = 0;
                ppvVar13 = extraout_RDX_01;
                do {
                  plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                     (long)*(int *)(plVar4[4] + lVar17 * 4) * 8);
                  lVar6 = *plVar5;
                  iVar16 = (int)plVar5[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar16 + 1,(int)ppvVar13);
                  if (((long)iVar16 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar16)) goto LAB_00839c31;
                } while ((*(int *)(*(long *)(lVar6 + 0xe8) + (long)iVar16 * 4) ==
                          *(int *)(*plVar5 + 0xd8)) &&
                        (lVar17 = lVar17 + 1, ppvVar13 = extraout_RDX_02,
                        lVar17 < *(int *)((long)plVar4 + 0x1c)));
                iVar16 = (int)lVar17;
                ppvVar13 = extraout_RDX_02;
              }
              if (*(int *)((long)plVar4 + 0x1c) <= iVar16) {
                lVar17 = *plVar4;
                uVar1 = *(undefined4 *)(lVar17 + 0xd8);
                iVar16 = (int)plVar4[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar17 + 0xe0),iVar16 + 1,(int)ppvVar13);
                if (((long)iVar16 < 0) || (*(int *)(lVar17 + 0xe4) <= iVar16)) goto LAB_00839c50;
                *(undefined4 *)(*(long *)(lVar17 + 0xe8) + (long)iVar16 * 4) = uVar1;
                if (0xfffffffd < (*(uint *)((long)plVar4 + 0x14) & 0xf) - 5) {
                  *(uint *)((long)plVar4 + 0x14) =
                       *(uint *)((long)plVar4 + 0x14) & 0xfff | iVar7 * 0x1000 + 0x1000U;
                }
                uVar8 = *(uint *)((long)plVar4 + 0x14) >> 0xc;
                if ((int)uVar20 <= (int)uVar8) goto LAB_00839c6f;
                plVar4[8] = (long)__s[uVar8];
                __s[uVar8] = plVar4;
                ppvVar13 = __s;
                if (0xfffffffd < (*(uint *)((long)plVar4 + 0x14) & 0xf) - 5) {
                  *(uint *)((long)plVar4 + 0x14) = *(uint *)((long)plVar4 + 0x14) & 0xfff;
                }
              }
            }
            lVar19 = lVar19 + 1;
          } while (lVar19 < *(int *)((long)plVar21 + 0x2c));
        }
      }
      ppvVar11 = (void **)((long)ppvVar11 + 1);
    } while (ppvVar11 != (void **)(ulong)(iVar7 + 1U));
  }
  return pVVar10;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsReverseNodesContained( Abc_Ntk_t * pNtk, Abc_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanout, * pFanin;
    int i, k, m, nLevels;
    // set the levels
    nLevels = Abc_NtkLevel( pNtk );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrStart( nLevels + 2 );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = ppNodes[i];
        assert( Abc_ObjIsCi(pObj) );
        Abc_NodeSetTravIdCurrent( pObj );
        // add to the array
        assert( pObj->Level == 0 );
        pObj->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vNodes, pObj->Level );
        Vec_PtrWriteEntry( vNodes, pObj->Level, pObj );
    }
    // iterate through the levels
    for ( i = 0; i <= nLevels; i++ )
    {
        // iterate through the nodes on each level
        for ( pObj = (Abc_Obj_t *)Vec_PtrEntry(vNodes, i); pObj; pObj = pObj->pCopy )
        {
            // iterate through the fanouts of each node
            Abc_ObjForEachFanout( pObj, pFanout, k )
            {
                // skip visited nodes
                if ( Abc_NodeIsTravIdCurrent(pFanout) )
                    continue;
                // visit the fanins of this fanout
                Abc_ObjForEachFanin( pFanout, pFanin, m )
                {
                    if ( !Abc_NodeIsTravIdCurrent(pFanin) )
                        break;
                }
                if ( m < Abc_ObjFaninNum(pFanout) )
                    continue;
                // all fanins are already collected

                // mark the node as visited
                Abc_NodeSetTravIdCurrent( pFanout );
                // handle the COs
                if ( Abc_ObjIsCo(pFanout) )
                    pFanout->Level = nLevels + 1;
                // add to the array
                pFanout->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vNodes, pFanout->Level );
                Vec_PtrWriteEntry( vNodes, pFanout->Level, pFanout );
                // handle the COs
                if ( Abc_ObjIsCo(pFanout) )
                    pFanout->Level = 0;
            }
        }
    }
    return vNodes;
}